

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

void trad_enc_update_keys(trad_enc_ctx *ctx,uint8_t c)

{
  uint32_t uVar1;
  uLong uVar2;
  uint8_t t;
  uchar local_a;
  uint8_t local_9;
  
  local_9 = c;
  uVar2 = cm_zlib_crc32((ulong)~ctx->keys[0],&local_9,1);
  ctx->keys[0] = ~(uint)uVar2;
  uVar1 = ((~(uint)uVar2 & 0xff) + ctx->keys[1]) * 0x8088405 + 1;
  ctx->keys[1] = uVar1;
  local_a = (uchar)(uVar1 >> 0x18);
  uVar2 = cm_zlib_crc32((ulong)~ctx->keys[2],&local_a,1);
  ctx->keys[2] = ~(uint)uVar2;
  return;
}

Assistant:

static void
trad_enc_update_keys(struct trad_enc_ctx *ctx, uint8_t c)
{
	uint8_t t;
#define CRC32(c, b) (crc32(c ^ 0xffffffffUL, &b, 1) ^ 0xffffffffUL)

	ctx->keys[0] = CRC32(ctx->keys[0], c);
	ctx->keys[1] = (ctx->keys[1] + (ctx->keys[0] & 0xff)) * 134775813L + 1;
	t = (ctx->keys[1] >> 24) & 0xff;
	ctx->keys[2] = CRC32(ctx->keys[2], t);
#undef CRC32
}